

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRFormatInformation.h
# Opt level: O0

Type __thiscall ZXing::QRCode::FormatInformation::type(FormatInformation *this)

{
  uint32_t uVar1;
  FormatInformation *this_local;
  Type local_4;
  
  uVar1 = this->mask;
  if (uVar1 == 0x2825) {
    local_4 = Model1;
  }
  else if (uVar1 == 0x4445) {
    local_4 = Micro;
  }
  else if ((uVar1 == 0x1fab2) || (uVar1 == 0x20a7b)) {
    local_4 = rMQR;
  }
  else {
    local_4 = Model2;
  }
  return local_4;
}

Assistant:

Type type() const
	{
		switch (mask) {
		case FORMAT_INFO_MASK_MODEL1: return Type::Model1;
		case FORMAT_INFO_MASK_MICRO: return Type::Micro;
		case FORMAT_INFO_MASK_RMQR: [[fallthrough]];
		case FORMAT_INFO_MASK_RMQR_SUB: return Type::rMQR;
		default: return Type::Model2;
		}
	}